

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kclient.cpp
# Opt level: O1

string * __thiscall
Kraken::KClient::public_method
          (string *__return_storage_ptr__,KClient *this,string *method,KInput *input)

{
  int iVar1;
  long *plVar2;
  char *pcVar3;
  runtime_error *this_00;
  long *plVar4;
  size_type *psVar5;
  string method_url;
  string path;
  string postdata;
  ostringstream oss;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  string local_1e8;
  string local_1c8 [32];
  long *local_1a8;
  long local_1a0;
  long local_198;
  long lStack_190;
  
  std::operator+(&local_228,"/",&this->version_);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_228);
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_198 = *plVar4;
    lStack_190 = plVar2[3];
    local_1a8 = &local_198;
  }
  else {
    local_198 = *plVar4;
    local_1a8 = (long *)*plVar2;
  }
  local_1a0 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_1a8,(ulong)(method->_M_dataplus)._M_p);
  psVar5 = (size_type *)(plVar2 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar2 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar5) {
    local_208.field_2._M_allocated_capacity = *psVar5;
    local_208.field_2._8_8_ = plVar2[3];
    local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
  }
  else {
    local_208.field_2._M_allocated_capacity = *psVar5;
    local_208._M_dataplus._M_p = (pointer)*plVar2;
  }
  local_208._M_string_length = plVar2[1];
  *plVar2 = (long)psVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if (local_1a8 != &local_198) {
    operator_delete(local_1a8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p);
  }
  std::operator+(&local_228,&this->url_,&local_208);
  curl_easy_setopt(this->curl_,0x2712,local_228._M_dataplus._M_p);
  build_query(&local_1e8,input);
  curl_easy_setopt(this->curl_,0x271f,local_1e8._M_dataplus._M_p);
  curl_easy_setopt(this->curl_,0x2727,0);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  curl_easy_setopt(this->curl_,0x2711,__return_storage_ptr__);
  iVar1 = curl_easy_perform(this->curl_);
  if (iVar1 == 0) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != &local_228.field_2) {
      operator_delete(local_228._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p);
    }
    return __return_storage_ptr__;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,"curl_easy_perform() failed: ",0x1c);
  pcVar3 = (char *)curl_easy_strerror(iVar1);
  std::operator<<((ostream *)&local_1a8,pcVar3);
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(this_00,local_1c8);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::string KClient::public_method(const std::string& method, 
				const KInput& input) const
{
   // build method URL
   std::string path = "/" + version_ + "/public/" + method;
   std::string method_url = url_ + path;   
   curl_easy_setopt(curl_, CURLOPT_URL, method_url.c_str());

   // build postdata 
   std::string postdata = build_query(input);
   curl_easy_setopt(curl_, CURLOPT_POSTFIELDS, postdata.c_str());

   // reset the http header
   curl_easy_setopt(curl_, CURLOPT_HTTPHEADER, NULL);

   // where CURL write callback function stores the response
   std::string response;
   curl_easy_setopt(curl_, CURLOPT_WRITEDATA, static_cast<void*>(&response));
 
   // perform CURL request
   CURLcode result = curl_easy_perform(curl_);
   if (result != CURLE_OK) {
      std::ostringstream oss;  
      oss << "curl_easy_perform() failed: "<< curl_easy_strerror(result);
      throw std::runtime_error(oss.str());
   }

   return response;
}